

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::mouseMoveEvent(QGroupBox *this,QMouseEvent *event)

{
  char cVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QRect local_d0;
  QPoint local_c0;
  QStyleOptionGroupBox box;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QWidget).field_0x8;
  memset(&box,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&box);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&box);
  pQVar5 = QWidget::style(&this->super_QWidget);
  local_d0 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)event);
  local_c0 = QPointF::toPoint((QPointF *)&local_d0);
  iVar4 = (**(code **)(*(long *)pQVar5 + 0xd0))(pQVar5,7,&box,&local_c0,this);
  cVar1 = *(char *)(lVar3 + 0x27c);
  bVar6 = iVar4 - 1U < 2;
  *(bool *)(lVar3 + 0x27c) = bVar6;
  if (((*(char *)(lVar3 + 0x279) == '\x01') && ((bool)cVar1 != bVar6)) &&
     (0xfffffffd < *(int *)(lVar3 + 0x280) - 3U)) {
    pQVar5 = QWidget::style(&this->super_QWidget);
    local_d0 = (QRect)(**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,7,&box,1,this);
    QWidget::update(&this->super_QWidget,&local_d0);
  }
  event[0xc] = (QMouseEvent)0x0;
  QStyleOptionGroupBox::~QStyleOptionGroupBox(&box);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGroupBox);
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl pressed = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                event->position().toPoint(), this);
    bool oldOverCheckBox = d->overCheckBox;
    d->overCheckBox = (pressed == QStyle::SC_GroupBoxCheckBox || pressed == QStyle::SC_GroupBoxLabel);
    if (d->checkable && (d->pressedControl == QStyle::SC_GroupBoxCheckBox || d->pressedControl == QStyle::SC_GroupBoxLabel)
        && (d->overCheckBox != oldOverCheckBox))
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));

    event->ignore();
}